

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::createImageFormatTypeTests
               (TestCaseGroup *testGroup,ImageFormatPropertyCase params)

{
  TestContext *pTVar1;
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  TestNode *pTVar2;
  allocator<char> local_92;
  allocator<char> local_91;
  Function local_90;
  undefined4 uStack_88;
  VkImageType VStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  Function local_78;
  undefined4 uStack_70;
  VkImageType VStack_6c;
  undefined4 local_68;
  uint uStack_64;
  string local_60;
  string local_40;
  
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"optimal",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_92);
  local_78 = params.testFunction;
  uStack_70 = 0;
  VStack_6c = params.imageType;
  local_68 = 0;
  arg0.format = (int)((ulong)params.imageType << 0x20);
  arg0.imageType = (int)(((ulong)params.imageType << 0x20) >> 0x20);
  arg0.testFunction = params.testFunction;
  arg0._16_8_ = (ulong)uStack_64 << 0x20;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,&local_40,&local_60,createImageFormatTypeTilingTests,arg0)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"linear",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_92);
  local_90 = params.testFunction;
  uStack_88 = 0;
  VStack_84 = params.imageType;
  local_80 = 1;
  arg0_00._20_4_ = uStack_7c;
  arg0_00.tiling = 1;
  arg0_00.format = (int)((ulong)params.imageType << 0x20);
  arg0_00.imageType = (int)(((ulong)params.imageType << 0x20) >> 0x20);
  arg0_00.testFunction = params.testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,&local_40,&local_60,createImageFormatTypeTilingTests,arg0_00)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void createImageFormatTypeTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase params)
{
	DE_ASSERT(params.tiling == VK_IMAGE_TILING_LAST);

	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "optimal",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_OPTIMAL)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "linear",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_LINEAR)));
}